

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::StreamingListener::UrlEncode_abi_cxx11_
          (string *__return_storage_ptr__,StreamingListener *this,char *str)

{
  int iVar1;
  uchar value;
  string local_40;
  byte local_1a;
  undefined1 local_19;
  char ch;
  StreamingListener *pSStack_18;
  char *str_local;
  string *result;
  
  local_19 = 0;
  pSStack_18 = this;
  str_local = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  strlen((char *)pSStack_18);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_1a = *(byte *)&(pSStack_18->super_EmptyTestEventListener).super_TestEventListener.
                       _vptr_TestEventListener;
  while (local_1a != 0) {
    iVar1 = (int)(char)local_1a;
    if (((iVar1 == 10) || (iVar1 - 0x25U < 2)) || (iVar1 == 0x3d)) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      String::FormatByte_abi_cxx11_(&local_40,(String *)(ulong)local_1a,value);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    local_1a = *(byte *)((long)&(pSStack_18->super_EmptyTestEventListener).super_TestEventListener.
                                _vptr_TestEventListener + 1);
    pSStack_18 = (StreamingListener *)
                 ((long)&(pSStack_18->super_EmptyTestEventListener).super_TestEventListener.
                         _vptr_TestEventListener + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StreamingListener::UrlEncode(const char* str) {
  std::string result;
  result.reserve(strlen(str) + 1);
  for (char ch = *str; ch != '\0'; ch = *++str) {
    switch (ch) {
      case '%':
      case '=':
      case '&':
      case '\n':
        result.push_back('%');
        result.append(String::FormatByte(static_cast<unsigned char>(ch)));
        break;
      default:
        result.push_back(ch);
        break;
    }
  }
  return result;
}